

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O0

void __thiscall iqxmlrpc::Server::work(Server *this)

{
  Impl *pIVar1;
  Impl *pIVar2;
  int iVar3;
  element_type *peVar4;
  Acceptor *this_00;
  Accepted_conn_factory *factory_;
  Reactor_base *pRVar5;
  byte local_1d;
  bool have_handlers;
  Server *this_local;
  
  peVar4 = std::auto_ptr<iqnet::Acceptor>::get(&this->impl->acceptor);
  if (peVar4 == (element_type *)0x0) {
    pIVar1 = this->impl;
    this_00 = (Acceptor *)operator_new(0x48);
    pIVar2 = this->impl;
    factory_ = get_conn_factory(this);
    pRVar5 = get_reactor(this);
    iqnet::Acceptor::Acceptor(this_00,&pIVar2->bind_addr,factory_,pRVar5);
    std::auto_ptr<iqnet::Acceptor>::reset(&pIVar1->acceptor,this_00);
    peVar4 = std::auto_ptr<iqnet::Acceptor>::operator->(&this->impl->acceptor);
    iqnet::Acceptor::set_firewall(peVar4,this->impl->firewall);
  }
  local_1d = 1;
  while ((local_1d != 0 && ((this->impl->exit_flag & 1U) == 0))) {
    pRVar5 = get_reactor(this);
    iVar3 = (*pRVar5->_vptr_Reactor_base[6])(pRVar5,0xffffffff);
    local_1d = (byte)iVar3 & 1;
  }
  std::auto_ptr<iqnet::Acceptor>::reset(&this->impl->acceptor,(element_type *)0x0);
  this->impl->exit_flag = false;
  return;
}

Assistant:

void Server::work()
{
  if( !impl->acceptor.get() )
  {
    impl->acceptor.reset(new iqnet::Acceptor( impl->bind_addr, get_conn_factory(), get_reactor()));
    impl->acceptor->set_firewall( impl->firewall );
  }

  for(bool have_handlers = true; have_handlers;)
  {
    if (impl->exit_flag)
      break;

    have_handlers = get_reactor()->handle_events();
  }

  impl->acceptor.reset(0);
  impl->exit_flag = false;
}